

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseSuffixes(StructuralParser *this,Expression *expression)

{
  pool_ref<soul::AST::Expression> *insertPos;
  UnqualifiedName *pUVar1;
  bool bVar2;
  bool bVar3;
  CommaSeparatedList *args_1;
  DotOperator *pDVar4;
  QualifiedIdentifier *args;
  CallOrCast *pCVar5;
  pool_ptr<soul::AST::DotOperator> dot;
  Context context;
  pool_ptr<soul::AST::DotOperator> local_a0;
  Context local_98;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_80;
  
  getContext(&local_98,this);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x29da52);
  if (bVar2) {
    expression = parseDotOperator(this,expression);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
    if (bVar2) {
      args_1 = parseCommaSeparatedListOfExpressions(this,false,false);
      cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_a0,expression);
      if (local_a0.object == (DotOperator *)0x0) {
        local_80.items._0_1_ = 0;
        pCVar5 = allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::AST::CommaSeparatedList&,bool>
                           (this,expression,args_1,(bool *)&local_80);
        expression = parseSuffixes(this,(Expression *)pCVar5);
      }
      else {
        insertPos = (args_1->items).items;
        pDVar4 = pool_ptr<soul::AST::DotOperator>::operator->(&local_a0);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
                  (&args_1->items,insertPos,&pDVar4->lhs);
        pDVar4 = pool_ptr<soul::AST::DotOperator>::operator->(&local_a0);
        pUVar1 = pDVar4->rhs;
        pDVar4 = pool_ptr<soul::AST::DotOperator>::operator->(&local_a0);
        IdentifierPath::IdentifierPath((IdentifierPath *)&local_80,(pDVar4->rhs->identifier).name);
        args = allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                         (this,&(pUVar1->super_Expression).super_Statement.super_ASTObject.context,
                          (IdentifierPath *)&local_80);
        ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_80);
        local_80.items._0_1_ = 1;
        pCVar5 = allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
                           (this,args,args_1,(bool *)&local_80);
        expression = parseSuffixes(this,(Expression *)pCVar5);
      }
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2cada8);
      if (bVar2) {
        expression = parseSubscriptWithBrackets(this,expression);
      }
      else {
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a1a55);
        if ((bVar2) ||
           (bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c42aa),
           bVar3)) {
          expression = parsePostIncDec(this,expression,bVar2);
        }
      }
    }
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_98);
  return expression;
}

Assistant:

AST::Expression& parseSuffixes (AST::Expression& expression)
    {
        auto context = getContext();

        if (matches (Operator::dot))
            return parseDotOperator (expression);

        if (matchIf (Operator::openParen))
        {
            auto& args = parseCommaSeparatedListOfExpressions (false, false);

            if (auto dot = cast<AST::DotOperator> (expression))
            {
                args.items.insert (args.items.begin(), dot->lhs);
                auto& fn = allocate<AST::QualifiedIdentifier> (dot->rhs.context, IdentifierPath (dot->rhs.identifier));
                return parseSuffixes (allocate<AST::CallOrCast> (fn, args, true));
            }

            return parseSuffixes (allocate<AST::CallOrCast> (expression, args, false));
        }

        if (matchIf (Operator::openBracket))  return parseSubscriptWithBrackets (expression);
        if (matchIf (Operator::plusplus))     return parsePostIncDec (expression, true);
        if (matchIf (Operator::minusminus))   return parsePostIncDec (expression, false);

        return expression;
    }